

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O2

base_learner * confidence_setup(options_i *options,vw *all)

{
  option_group_definition *this;
  base_learner *l;
  single_learner *base;
  learner<confidence,_example> *plVar1;
  ostream *poVar2;
  code *predict;
  code *learn;
  bool confidence_after_training;
  bool confidence_arg;
  option_group_definition new_options;
  free_ptr<confidence> data;
  bool local_23e;
  bool local_23d;
  allocator local_23c;
  allocator local_23b;
  allocator local_23a;
  allocator local_239;
  string local_238 [32];
  string local_218;
  string local_1f8 [32];
  string local_1d8;
  string local_1b8;
  option_group_definition local_198;
  undefined1 local_160 [112];
  bool local_f0;
  undefined1 local_c0 [160];
  
  local_23d = false;
  local_23e = false;
  std::__cxx11::string::string((string *)&local_1b8,"Confidence",(allocator *)local_160);
  VW::config::option_group_definition::option_group_definition(&local_198,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::string((string *)&local_1d8,"confidence",&local_239);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_160,&local_1d8,&local_23d);
  local_f0 = true;
  std::__cxx11::string::string(local_1f8,"Get confidence for binary predictions",&local_23a);
  std::__cxx11::string::_M_assign((string *)(local_160 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                   (&local_198,(typed_option<bool> *)local_160);
  std::__cxx11::string::string((string *)&local_218,"confidence_after_training",&local_23b);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_c0,&local_218,&local_23e)
  ;
  std::__cxx11::string::string(local_238,"Confidence after training",&local_23c);
  std::__cxx11::string::_M_assign((string *)(local_c0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (this,(typed_option<bool> *)local_c0);
  std::__cxx11::string::~string(local_238);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_c0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string(local_1f8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_160);
  std::__cxx11::string::~string((string *)&local_1d8);
  (**options->_vptr_options_i)(options,&local_198);
  if (local_23d != false) {
    if (all->training != false) {
      scoped_calloc_or_throw<confidence>();
      *(vw **)local_160._8_8_ = all;
      learn = predict_or_learn_with_confidence<true,false>;
      if (local_23e != false) {
        learn = predict_or_learn_with_confidence<true,true>;
      }
      predict = predict_or_learn_with_confidence<false,false>;
      if (local_23e != false) {
        predict = predict_or_learn_with_confidence<false,true>;
      }
      l = setup_base(options,all);
      base = LEARNER::as_singleline<char,char>(l);
      plVar1 = LEARNER::init_learner<confidence,example,LEARNER::learner<char,example>>
                         ((free_ptr<confidence> *)local_160,base,learn,predict);
      *(undefined8 *)(plVar1 + 0x58) = *(undefined8 *)(plVar1 + 0x18);
      *(code **)(plVar1 + 0x68) = return_confidence_example;
      std::unique_ptr<confidence,_void_(*)(void_*)>::~unique_ptr
                ((unique_ptr<confidence,_void_(*)(void_*)> *)local_160);
      goto LAB_001bda63;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when saving the model and avoid --test_only"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  plVar1 = (learner<confidence,_example> *)0x0;
LAB_001bda63:
  VW::config::option_group_definition::~option_group_definition(&local_198);
  return (base_learner *)plVar1;
}

Assistant:

base_learner* confidence_setup(options_i& options, vw& all)
{
  bool confidence_arg = false;
  bool confidence_after_training = false;
  option_group_definition new_options("Confidence");
  new_options.add(make_option("confidence", confidence_arg).keep().help("Get confidence for binary predictions"))
      .add(make_option("confidence_after_training", confidence_after_training).help("Confidence after training"));
  options.add_and_parse(new_options);

  if (!confidence_arg)
    return nullptr;

  if (!all.training)
  {
    cout << "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when "
            "saving the model and avoid --test_only"
         << endl;
    return nullptr;
  }

  auto data = scoped_calloc_or_throw<confidence>();
  data->all = &all;

  void (*learn_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;
  void (*predict_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;

  if (confidence_after_training)
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, true>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, true>;
  }
  else
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, false>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, false>;
  }

  // Create new learner
  learner<confidence, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), learn_with_confidence_ptr, predict_with_confidence_ptr);

  l.set_finish_example(return_confidence_example);

  return make_base(l);
}